

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

uint32_t __thiscall TldAsKey::Hash(TldAsKey *this)

{
  uint32_t uVar1;
  size_t sVar2;
  
  uVar1 = this->hash;
  if (uVar1 == 0) {
    this->hash = 0xbabac001;
    uVar1 = 0xbabac001;
    if (this->tld_len != 0) {
      sVar2 = 0;
      do {
        uVar1 = (uint)this->tld[sVar2] + uVar1 * 0x65;
        this->hash = uVar1;
        sVar2 = sVar2 + 1;
      } while (this->tld_len != sVar2);
    }
  }
  return uVar1;
}

Assistant:

uint32_t TldAsKey::Hash()
{
    if (hash == 0)
    {
        hash = 0xBABAC001;

        for (size_t i = 0; i < tld_len; i++)
        {
            hash = hash * 101 + tld[i];
        }
    }

    return hash;
}